

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

void __thiscall
args::Subparser::Subparser(Subparser *this,Command *command_,HelpParams *helpParams_)

{
  string local_58;
  code *local_38 [2];
  code *local_28;
  code *local_20;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_38[1] = (code *)0x0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_38[0] = Group::Validators::AllChildGroups;
  local_20 = std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::
             _M_invoke;
  local_28 = std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::
             _M_manager;
  Group::Group(&this->super_Group,&local_58,(function<bool_(const_args::Group_&)> *)local_38,None);
  std::_Function_base::~_Function_base((_Function_base *)local_38);
  std::__cxx11::string::~string((string *)&local_58);
  (this->super_Group).super_Base._vptr_Base = (_func_int **)&PTR__Subparser_0011f3d8;
  (this->args).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->args).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->args).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->kicked).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  this->parser = (ArgumentParser *)0x0;
  (this->kicked).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->kicked).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->helpParams = helpParams_;
  this->command = command_;
  this->isParsed = false;
  return;
}

Assistant:

Subparser(const Command &command_, const HelpParams &helpParams_) : Group({}, Validators::AllChildGroups), helpParams(helpParams_), command(command_)
            {
            }